

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_formatter-inl.h
# Opt level: O0

int __thiscall
spdlog::json_formatter::clone
          (json_formatter *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  bool bVar1;
  pointer ppVar2;
  pair<std::__detail::_Node_iterator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_true,_false>,_bool>
  pVar3;
  value_type *populator;
  const_iterator __end1;
  const_iterator __begin1;
  populator_set *__range1;
  populator_set populators;
  unordered_set<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>_>
  *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  _Node_iterator_base<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_false>
  in_stack_ffffffffffffff48;
  json_formatter *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  unordered_set<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>_>
  *in_stack_ffffffffffffff88;
  undefined1 local_70 [8];
  reference local_68;
  _Node_iterator_base<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_false>
  local_60;
  _Node_iterator_base<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_false>
  local_58;
  code *local_50;
  __fn *local_10;
  json_formatter *local_8;
  
  this_00 = this;
  local_10 = __fn;
  local_8 = this;
  std::
  unordered_set<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>_>
  ::unordered_set((unordered_set<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>_>
                   *)0x16104e);
  local_50 = __fn + 0x28;
  local_58._M_cur =
       (__node_type *)
       std::
       unordered_set<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>_>
       ::begin(in_stack_ffffffffffffff38);
  local_60._M_cur =
       (__node_type *)
       std::
       unordered_set<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>_>
       ::end(in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_58,&local_60);
    if (!bVar1) break;
    local_68 = std::__detail::
               _Node_const_iterator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_true,_false>
               ::operator*((_Node_const_iterator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_true,_false>
                            *)0x16109c);
    ppVar2 = std::
             unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>
             ::operator->((unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>
                           *)0x1610ab);
    (*ppVar2->_vptr_populator[3])(local_70);
    pVar3 = std::
            unordered_set<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>_>
            ::insert((unordered_set<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>_>
                      *)this_00,(value_type *)in_stack_ffffffffffffff48._M_cur);
    in_stack_ffffffffffffff48._M_cur =
         (__node_type *)
         pVar3.first.
         super__Node_iterator_base<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_false>
         ._M_cur;
    in_stack_ffffffffffffff47 = pVar3.second;
    std::
    unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>::
    ~unique_ptr((unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>
                 *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    std::__detail::
    _Node_const_iterator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_true,_false>
    ::operator++((_Node_const_iterator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_true,_false>
                  *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  }
  details::
  make_unique<spdlog::json_formatter,std::unordered_set<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::hash<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::equal_to<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::allocator<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>>,std::__cxx11::string_const&>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::unique_ptr<spdlog::formatter,std::default_delete<spdlog::formatter>>::
  unique_ptr<spdlog::json_formatter,std::default_delete<spdlog::json_formatter>,void>
            ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)this_00,
             (unique_ptr<spdlog::json_formatter,_std::default_delete<spdlog::json_formatter>_> *)
             in_stack_ffffffffffffff48._M_cur);
  std::unique_ptr<spdlog::json_formatter,_std::default_delete<spdlog::json_formatter>_>::~unique_ptr
            ((unique_ptr<spdlog::json_formatter,_std::default_delete<spdlog::json_formatter>_> *)
             CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  std::
  unordered_set<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>_>
  ::~unordered_set((unordered_set<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>,_std::hash<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::equal_to<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>,_std::allocator<std::unique_ptr<spdlog::populators::populator,_std::default_delete<spdlog::populators::populator>_>_>_>
                    *)0x161173);
  return (int)this;
}

Assistant:

SPDLOG_INLINE std::unique_ptr<formatter> json_formatter::clone() const
{
    populators::populator_set populators;
    for (const auto &populator : populators_)
    {
        populators.insert(populator->clone());
    }
    return details::make_unique<json_formatter>(std::move(populators), kEOL);
}